

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_helper.c
# Opt level: O0

void helper_crypto_sha512su0_aarch64(void *vd,void *vn)

{
  long lVar1;
  long lVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t d1;
  uint64_t d0;
  uint64_t *rn;
  uint64_t *rd;
  void *vn_local;
  void *vd_local;
  
  lVar1 = *vd;
  lVar2 = *(long *)((long)vd + 8);
  uVar3 = s0_512(*(uint64_t *)((long)vd + 8));
  uVar4 = s0_512(*vn);
  *(uint64_t *)vd = uVar3 + lVar1;
  *(uint64_t *)((long)vd + 8) = uVar4 + lVar2;
  return;
}

Assistant:

void HELPER(crypto_sha512su0)(void *vd, void *vn)
{
    uint64_t *rd = vd;
    uint64_t *rn = vn;
    uint64_t d0 = rd[0];
    uint64_t d1 = rd[1];

    d0 += s0_512(rd[1]);
    d1 += s0_512(rn[0]);

    rd[0] = d0;
    rd[1] = d1;
}